

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall UnifiedRegex::CharSetInner::Get(CharSetInner *this,uint level,uint k)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x21e,"(level > 0)","level > 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pCVar1 = this->children[k >> ((char)level * '\x04' + 4U & 0x1f) & 0xf];
  if (pCVar1 != (CharSetNode *)0x0) {
    iVar4 = (*pCVar1->_vptr_CharSetNode[5])(pCVar1,(ulong)(level - 1),(ulong)k);
    return SUB41(iVar4,0);
  }
  return false;
}

Assistant:

bool CharSetInner::Get(uint level, uint k) const
    {
        Assert(level > 0);
        uint i = innerIdx(level--, k);
        if (children[i] == nullptr)
            return false;
        else
            return children[i]->Get(level, k);
    }